

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

UnicodeString *
icu_63::MessageImpl::appendSubMessageWithoutSkipSyntax
          (MessagePattern *msgPattern,int32_t msgStart,UnicodeString *result)

{
  UMessagePatternPartType UVar1;
  int32_t start;
  UnicodeString *pUVar2;
  Part *pPVar3;
  int32_t index;
  UMessagePatternPartType type;
  Part *part;
  int32_t i;
  int32_t prevIndex;
  UnicodeString *msgString;
  UnicodeString *result_local;
  int32_t msgStart_local;
  MessagePattern *msgPattern_local;
  
  pUVar2 = MessagePattern::getPatternString(msgPattern);
  pPVar3 = MessagePattern::getPart(msgPattern,msgStart);
  part._4_4_ = MessagePattern::Part::getLimit(pPVar3);
  part._0_4_ = msgStart;
  while( true ) {
    part._0_4_ = (int32_t)part + 1;
    pPVar3 = MessagePattern::getPart(msgPattern,(int32_t)part);
    UVar1 = MessagePattern::Part::getType(pPVar3);
    start = MessagePattern::Part::getIndex(pPVar3);
    if (UVar1 == UMSGPAT_PART_TYPE_MSG_LIMIT) break;
    if (UVar1 == UMSGPAT_PART_TYPE_SKIP_SYNTAX) {
      icu_63::UnicodeString::append(result,pUVar2,part._4_4_,start - part._4_4_);
      part._4_4_ = MessagePattern::Part::getLimit(pPVar3);
    }
    else if (UVar1 == UMSGPAT_PART_TYPE_ARG_START) {
      icu_63::UnicodeString::append(result,pUVar2,part._4_4_,start - part._4_4_);
      part._0_4_ = MessagePattern::getLimitPartIndex(msgPattern,(int32_t)part);
      pPVar3 = MessagePattern::getPart(msgPattern,(int32_t)part);
      part._4_4_ = MessagePattern::Part::getLimit(pPVar3);
      appendReducedApostrophes(pUVar2,start,part._4_4_,result);
    }
  }
  pUVar2 = icu_63::UnicodeString::append(result,pUVar2,part._4_4_,start - part._4_4_);
  return pUVar2;
}

Assistant:

UnicodeString &
MessageImpl::appendSubMessageWithoutSkipSyntax(const MessagePattern &msgPattern,
                                               int32_t msgStart,
                                               UnicodeString &result) {
    const UnicodeString &msgString=msgPattern.getPatternString();
    int32_t prevIndex=msgPattern.getPart(msgStart).getLimit();
    for(int32_t i=msgStart;;) {
        const MessagePattern::Part &part=msgPattern.getPart(++i);
        UMessagePatternPartType type=part.getType();
        int32_t index=part.getIndex();
        if(type==UMSGPAT_PART_TYPE_MSG_LIMIT) {
            return result.append(msgString, prevIndex, index-prevIndex);
        } else if(type==UMSGPAT_PART_TYPE_SKIP_SYNTAX) {
            result.append(msgString, prevIndex, index-prevIndex);
            prevIndex=part.getLimit();
        } else if(type==UMSGPAT_PART_TYPE_ARG_START) {
            result.append(msgString, prevIndex, index-prevIndex);
            prevIndex=index;
            i=msgPattern.getLimitPartIndex(i);
            index=msgPattern.getPart(i).getLimit();
            appendReducedApostrophes(msgString, prevIndex, index, result);
            prevIndex=index;
        }
    }
}